

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O2

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::load_data(segment_impl<ELFIO::Elf32_Phdr> *this)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  ulong uVar7;
  pointer __p;
  long *plVar8;
  bool bVar9;
  streampos sVar10;
  undefined4 extraout_var_00;
  
  iVar5 = (*(this->super_segment)._vptr_segment[3])();
  bVar9 = true;
  if ((iVar5 != 0) &&
     (iVar5 = (*(this->super_segment)._vptr_segment[0xd])(this), CONCAT44(extraout_var,iVar5) != 0))
  {
    uVar1 = (this->ph).p_offset;
    uVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (this->convertor->need_conversion == false) {
      uVar4 = uVar1;
    }
    sVar10 = address_translator::operator[](this->translator,(streampos)ZEXT416(uVar4));
    uVar6 = sVar10._M_off;
    iVar5 = (*(this->super_segment)._vptr_segment[0xd])(this);
    uVar7 = CONCAT44(extraout_var_00,iVar5);
    uVar2 = this->stream_size;
    if ((((uVar6 <= uVar2) && (uVar7 <= uVar2)) && (uVar7 <= uVar2 - uVar6)) &&
       (uVar7 != 0xffffffffffffffff)) {
      __p = (pointer)operator_new__(uVar7 + 1,(nothrow_t *)&std::nothrow);
      std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->data,__p);
      std::istream::seekg(this->pstream,uVar6,0);
      pcVar3 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      if ((pcVar3 != (char *)0x0) &&
         (plVar8 = (long *)std::istream::read((char *)this->pstream,(long)pcVar3),
         (*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0)) {
        (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar7] = '\0';
        this->is_loaded = true;
        return true;
      }
    }
    bVar9 = false;
    std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
              ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->data,(pointer)0x0);
  }
  return bVar9;
}

Assistant:

bool load_data() const
    {
        if ( PT_NULL == get_type() || 0 == get_file_size() ) {
            return true;
        }

        Elf_Xword p_offset = ( *translator )[( *convertor )( ph.p_offset )];
        Elf_Xword size     = get_file_size();

        // Check for integer overflow in offset calculation
        if (p_offset > get_stream_size()) {
            data = nullptr;
            return false;
        }

        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - p_offset)) {
            data = nullptr;
            return false;
        }

        // Check if size can be safely converted to size_t
        if (size > std::numeric_limits<size_t>::max() - 1) {
            data = nullptr;
            return false;
        }

        data.reset( new ( std::nothrow ) char[(size_t)size + 1] );

        pstream->seekg( p_offset );
        if ( nullptr != data.get() && pstream->read( data.get(), size ) ) {
            data.get()[size] = 0;
        }
        else {
            data = nullptr;
            return false;
        }

        is_loaded = true;

        return true;
    }